

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O0

void chapter3::file_to_vector
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *vec,ifstream *ifile)

{
  bool bVar1;
  istream *piVar2;
  string local_38 [8];
  string word;
  ifstream *ifile_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_local;
  
  std::__cxx11::string::string(local_38);
  while( true ) {
    piVar2 = std::operator>>((istream *)ifile,local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(vec,(value_type *)local_38);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void chapter3::file_to_vector(vector<string> &vec, ifstream &ifile) {
    string word;
    while (ifile >> word) {
        vec.push_back(word);
    }
}